

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvwriter.cc
# Opt level: O1

int64 __thiscall mkvmuxer::MkvWriter::Position(MkvWriter *this)

{
  long lVar1;
  
  if ((FILE *)this->file_ == (FILE *)0x0) {
    return 0;
  }
  lVar1 = ftell((FILE *)this->file_);
  return lVar1;
}

Assistant:

int64 MkvWriter::Position() const {
  if (!file_)
    return 0;

#ifdef _MSC_VER
  return _ftelli64(file_);
#else
  return ftell(file_);
#endif
}